

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline.cc
# Opt level: O1

bool __thiscall S2Polyline::FindValidationError(S2Polyline *this,S2Error *error)

{
  double *pdVar1;
  double dVar2;
  bool bVar3;
  S2Point *pSVar4;
  S2Point *pSVar5;
  long lVar6;
  char *format;
  bool bVar7;
  int k;
  Code code;
  uint k_00;
  double *ap;
  uint k_01;
  double local_48;
  VType aVStack_40 [2];
  
  bVar7 = 0 < this->num_vertices_;
  if (0 < this->num_vertices_) {
    pSVar4 = vertex(this,0);
    bVar3 = S2::IsUnitLength(pSVar4);
    if (bVar3) {
      k = 0;
      do {
        k = k + 1;
        bVar7 = k < this->num_vertices_;
        if (this->num_vertices_ <= k) goto LAB_00212878;
        pSVar4 = vertex(this,k);
        bVar3 = S2::IsUnitLength(pSVar4);
      } while (bVar3);
    }
    S2Error::Init(error,NOT_UNIT_LENGTH,"Vertex %d is not unit length");
    if (bVar7) {
      return true;
    }
  }
LAB_00212878:
  bVar7 = 1 < this->num_vertices_;
  if (1 < this->num_vertices_) {
    k_01 = 1;
    do {
      k_00 = k_01 - 1;
      pSVar4 = vertex(this,k_00);
      pSVar5 = vertex(this,k_01);
      if ((pSVar4->c_[0] == pSVar5->c_[0]) && (!NAN(pSVar4->c_[0]) && !NAN(pSVar5->c_[0]))) {
        lVar6 = 0;
        do {
          if (lVar6 == 0x10) {
            format = "Vertices %d and %d are identical";
            code = DUPLICATE_VERTICES;
            goto LAB_00212987;
          }
          dVar2 = *(double *)((long)pSVar4->c_ + lVar6 + 8);
          pdVar1 = (double *)((long)pSVar5->c_ + lVar6 + 8);
          lVar6 = lVar6 + 8;
        } while ((dVar2 == *pdVar1) && (!NAN(dVar2) && !NAN(*pdVar1)));
      }
      pSVar4 = vertex(this,k_00);
      pSVar5 = vertex(this,k_01);
      local_48 = -pSVar5->c_[0];
      aVStack_40[0] = -pSVar5->c_[1];
      aVStack_40[1] = -pSVar5->c_[2];
      if ((pSVar4->c_[0] == local_48) && (!NAN(pSVar4->c_[0]) && !NAN(local_48))) {
        lVar6 = 8;
        do {
          if (lVar6 == 0x18) {
            format = "Vertices %d and %d are antipodal";
            code = ANTIPODAL_VERTICES;
LAB_00212987:
            S2Error::Init(error,code,format,(ulong)k_00,(ulong)k_01);
            return bVar7;
          }
          dVar2 = *(double *)((long)pSVar4->c_ + lVar6);
          pdVar1 = (double *)((long)aVStack_40 + lVar6 + -8);
          lVar6 = lVar6 + 8;
        } while ((dVar2 == *pdVar1) && (!NAN(dVar2) && !NAN(*pdVar1)));
      }
      k_01 = k_01 + 1;
      bVar7 = (int)k_01 < this->num_vertices_;
    } while ((int)k_01 < this->num_vertices_);
  }
  return bVar7;
}

Assistant:

bool S2Polyline::FindValidationError(S2Error* error) const {
  // All vertices must be unit length.
  for (int i = 0; i < num_vertices(); ++i) {
    if (!S2::IsUnitLength(vertex(i))) {
      error->Init(S2Error::NOT_UNIT_LENGTH, "Vertex %d is not unit length", i);
      return true;
    }
  }
  // Adjacent vertices must not be identical or antipodal.
  for (int i = 1; i < num_vertices(); ++i) {
    if (vertex(i - 1) == vertex(i)) {
      error->Init(S2Error::DUPLICATE_VERTICES,
                  "Vertices %d and %d are identical", i - 1, i);
      return true;
    }
    if (vertex(i - 1) == -vertex(i)) {
      error->Init(S2Error::ANTIPODAL_VERTICES,
                  "Vertices %d and %d are antipodal", i - 1, i);
      return true;
    }
  }
  return false;
}